

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidLoop5(void)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  Type *pTVar8;
  ActivationReLU *this;
  TypeUnion this_00;
  LayerUnion LVar9;
  NeuralNetwork *pNVar10;
  ostream *poVar11;
  Result res;
  Model m;
  NeuralNetwork nnCondition;
  NeuralNetwork nnBody;
  undefined1 local_128 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  Model local_100;
  undefined1 local_d0 [16];
  RepeatedPtrFieldBase local_c0 [3];
  undefined1 local_78 [16];
  RepeatedPtrFieldBase local_68 [3];
  
  CoreML::Specification::Model::Model(&local_100);
  if (local_100.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_100.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_100.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_d0._0_8_ = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_d0);
  if ((RepeatedPtrFieldBase *)local_d0._0_8_ != local_c0) {
    operator_delete((void *)local_d0._0_8_,(ulong)((long)local_c0[0].arena_ + 1));
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
    pFVar6 = pTVar5->type_;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar2 = (pAVar7->shape_).current_size_;
  if (iVar2 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar2 + 1);
    iVar2 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar2 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar2] = 1;
  if (local_100.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_100.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_100.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_d0._0_8_ = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_d0);
  if ((RepeatedPtrFieldBase *)local_d0._0_8_ != local_c0) {
    operator_delete((void *)local_d0._0_8_,(ulong)((long)local_c0[0].arena_ + 1));
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)local_d0);
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     (local_c0,(Type *)0x0);
  if (pTVar8->_oneof_case_[0] == 0x33e) {
    LVar9 = pTVar8->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar8);
    pTVar8->_oneof_case_[0] = 0x33e;
    LVar9.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    CoreML::Specification::GreaterThanLayerParams::GreaterThanLayerParams(LVar9.greaterthan_);
    (pTVar8->layer_).greaterthan_ = (GreaterThanLayerParams *)LVar9;
  }
  ((LVar9.convolution_)->kernelsize_).current_size_ = 0x3f800000;
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"cond","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((RepeatedPtrFieldBase *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0].arena_ + 1));
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar8,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar8,"cond");
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)local_78);
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     (local_68,(Type *)0x0);
  if (pTVar8->_oneof_case_[0] == 0x82) {
    LVar9 = pTVar8->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar8);
    pTVar8->_oneof_case_[0] = 0x82;
    LVar9.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(LVar9.activation_);
    (pTVar8->layer_).activation_ = (ActivationParams *)LVar9;
  }
  if (*(int *)((long)&((LVar9.convolution_)->kernelsize_).rep_ + 4) != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(LVar9.activation_);
    *(undefined4 *)((long)&((LVar9.convolution_)->kernelsize_).rep_ + 4) = 10;
    this = (ActivationReLU *)operator_new(0x18);
    CoreML::Specification::ActivationReLU::ActivationReLU(this);
    ((LVar9.activation_)->NonlinearityType_).relu_ = this;
  }
  pcVar1 = local_128 + 0x10;
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"relu","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar8,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar8,"B");
  if (local_100._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_100);
    local_100._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_100.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  (local_100.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&(local_100.Type_.pipeline_)->models_,(Type *)0x0);
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"for_loop","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (pTVar8->_oneof_case_[0] == 0x267) {
    LVar9 = pTVar8->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar8);
    pTVar8->_oneof_case_[0] = 0x267;
    LVar9.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::LoopLayerParams::LoopLayerParams(LVar9.loop_);
    (pTVar8->layer_).loop_ = (LoopLayerParams *)LVar9;
  }
  pNVar10 = (LVar9.loop_)->bodynetwork_;
  if (pNVar10 == (NeuralNetwork *)0x0) {
    pNVar10 = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(pNVar10);
    (LVar9.loop_)->bodynetwork_ = pNVar10;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar10,(NeuralNetwork *)local_78);
  pNVar10 = (NeuralNetwork *)(LVar9.innerproduct_)->bias_;
  if (pNVar10 == (NeuralNetwork *)0x0) {
    pNVar10 = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(pNVar10);
    (LVar9.branch_)->elsebranch_ = pNVar10;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar10,(NeuralNetwork *)local_d0);
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"cond","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(LVar9.loop_)->conditionvar_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  CoreML::validate<(MLModelType)500>((Result *)local_128,&local_100);
  bVar3 = CoreML::Result::good((Result *)local_128);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1265);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._8_8_ != &local_110) {
    operator_delete((void *)local_128._8_8_,local_110._0_8_ + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)local_78);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)local_d0);
  CoreML::Specification::Model::~Model(&local_100);
  return (uint)bVar3;
}

Assistant:

int testInvalidLoop5() {
    /*
     output blob not generated outside the loop
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    Specification::NeuralNetwork nnCondition;
    auto *l1 = nnCondition.add_layers();
    l1->mutable_greaterthan()->set_alpha(1.0);
    l1->set_name("cond");
    l1->add_input("A");
    l1->add_output("cond");
    
    Specification::NeuralNetwork nnBody;
    auto *l2 = nnBody.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu");
    l2->add_input("A");
    l2->add_output("B");
    
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    
    auto *l3 = nnMain->add_layers();
    l3->set_name("for_loop");
    auto *loop_params = l3->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);
    loop_params->mutable_conditionnetwork()->CopyFrom(nnCondition);
    loop_params->set_conditionvar("cond");
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}